

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int set_throttle(char *spec,usa *rsa,char *uri)

{
  int iVar1;
  ptrdiff_t pVar2;
  int local_60;
  double dStack_58;
  int matched;
  double v;
  undefined1 auStack_48 [7];
  char mult;
  vec val;
  vec vec;
  int throttle;
  char *uri_local;
  usa *rsa_local;
  char *spec_local;
  
  vec.len._4_4_ = 0;
  rsa_local = (usa *)spec;
  while (rsa_local = (usa *)next_option((char *)rsa_local,(vec *)&val.len,(vec *)auStack_48),
        rsa_local != (usa *)0x0) {
    v._7_1_ = ',';
    if ((((_auStack_48 != (char *)0x0) &&
         (iVar1 = __isoc99_sscanf(_auStack_48,"%lf%c",&stack0xffffffffffffffa8,(long)&v + 7),
         0 < iVar1)) && (0.0 <= dStack_58)) &&
       (((iVar1 = lowercase((char *)((long)&v + 7)), iVar1 == 0x6b ||
         (iVar1 = lowercase((char *)((long)&v + 7)), iVar1 == 0x6d)) || (v._7_1_ == ',')))) {
      iVar1 = lowercase((char *)((long)&v + 7));
      if (iVar1 == 0x6b) {
        local_60 = 0x400;
      }
      else {
        iVar1 = lowercase((char *)((long)&v + 7));
        local_60 = 1;
        if (iVar1 == 0x6d) {
          local_60 = 0x100000;
        }
      }
      dStack_58 = (double)local_60 * dStack_58;
      if ((vec.ptr == (char *)0x1) && (*(char *)val.len == '*')) {
        vec.len._4_4_ = (int)dStack_58;
      }
      else {
        iVar1 = parse_match_net((vec *)&val.len,rsa,0);
        if (iVar1 < 0) {
          pVar2 = match_prefix((char *)val.len,(size_t)vec.ptr,uri);
          if (0 < pVar2) {
            vec.len._4_4_ = (int)dStack_58;
          }
        }
        else if (iVar1 != 0) {
          vec.len._4_4_ = (int)dStack_58;
        }
      }
    }
  }
  return vec.len._4_4_;
}

Assistant:

static int
set_throttle(const char *spec, const union usa *rsa, const char *uri)
{
	int throttle = 0;
	struct vec vec, val;
	char mult;
	double v;

	while ((spec = next_option(spec, &vec, &val)) != NULL) {
		mult = ',';
		if ((val.ptr == NULL)
		    || (sscanf(val.ptr, "%lf%c", &v, &mult)
		        < 1) // NOLINT(cert-err34-c) 'sscanf' used to convert a string
		             // to an integer value, but function will not report
		             // conversion errors; consider using 'strtol' instead
		    || (v < 0)
		    || ((lowercase(&mult) != 'k') && (lowercase(&mult) != 'm')
		        && (mult != ','))) {
			continue;
		}
		v *= (lowercase(&mult) == 'k')
		         ? 1024
		         : ((lowercase(&mult) == 'm') ? 1048576 : 1);
		if (vec.len == 1 && vec.ptr[0] == '*') {
			throttle = (int)v;
		} else {
			int matched = parse_match_net(&vec, rsa, 0);
			if (matched >= 0) {
				/* a valid IP subnet */
				if (matched) {
					throttle = (int)v;
				}
			} else if (match_prefix(vec.ptr, vec.len, uri) > 0) {
				throttle = (int)v;
			}
		}
	}

	return throttle;
}